

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds.cpp
# Opt level: O1

int main(void)

{
  void *__s;
  unsigned_long __n2;
  ulong __n;
  long lVar1;
  size_t n;
  istream_iterator<int,_char,_std::char_traits<char>,_long> reader;
  ulong local_58;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_50;
  ostream_iterator<int,_char,_std::char_traits<char>_> local_40;
  istream_type *local_30;
  int local_28;
  undefined1 local_24;
  
  std::istream::_M_extract<unsigned_long>(&std::cin);
  __n = -(ulong)(local_58 >> 0x3e != 0) | local_58 << 2;
  __s = operator_new__(__n);
  memset(__s,0,__n);
  local_50._M_stream = (istream_type *)&std::cin;
  local_50._M_ok = true;
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read(&local_50);
  if (local_58 != 0) {
    local_30 = local_50._M_stream;
    local_28 = local_50._M_value;
    local_24 = local_50._M_ok;
    std::__copy_n<std::istream_iterator<int,char,std::char_traits<char>,long>,unsigned_long,int*>
              (&local_30,local_58,__s);
  }
  local_40._M_stream = (ostream_type *)&std::cout;
  local_40._M_string = "\n";
  if (local_58 != 0) {
    lVar1 = local_58 << 2;
    do {
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=
                (&local_40,(int *)((long)__s + lVar1 + -4));
      lVar1 = lVar1 + -4;
    } while (lVar1 != 0);
  }
  operator_delete__(__s);
  return 0;
}

Assistant:

int main() {
  size_t n;
  std::cin >> n;
  auto array = std::make_unique<int[]>(n);
  auto reader = std::istream_iterator<int>(std::cin);
  auto printer = std::ostream_iterator<int>(std::cout, "\n");
  std::copy_n(reader, n, array.get());
  std::reverse_copy(array.get(), array.get() + n, printer);
  return 0;
}